

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,bool implib,string *outPrefix,string *outBase,
          string *outSuffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  char *pcVar5;
  string *psVar6;
  char *pcVar7;
  _Alloc_hider __s;
  LinkClosure *pLVar8;
  long *plVar9;
  size_t sVar10;
  size_type *psVar11;
  ulong *puVar12;
  bool bVar13;
  string fw_prefix;
  string ll;
  string local_148;
  string local_128;
  char *local_108;
  string *local_100;
  char *local_f8;
  string *local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  string local_c8;
  uint local_a4;
  string local_a0;
  string local_80;
  char *local_60;
  string *local_58;
  string local_50;
  
  local_100 = config;
  if (this->Target->TargetTypeValue < OBJECT_LIBRARY) {
    local_f0 = outBase;
    if (implib) {
      pcVar3 = this->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"CMAKE_IMPORT_LIBRARY_SUFFIX","");
      pcVar7 = cmMakefile::GetDefinition(pcVar3,&local_50);
      bVar13 = pcVar7 == (char *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar13 = false;
    }
    psVar6 = local_100;
    if (bVar13) {
      std::__cxx11::string::_M_replace
                ((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x512e03);
      std::__cxx11::string::_M_replace
                ((ulong)local_f0,0,(char *)local_f0->_M_string_length,0x512e03);
      std::__cxx11::string::_M_replace
                ((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x512e03);
    }
    else {
      TVar2 = this->Target->TargetTypeValue;
      if ((TVar2 & ~STATIC_LIBRARY) != SHARED_LIBRARY) {
        implib = TVar2 == EXECUTABLE && implib;
      }
      paVar1 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      local_58 = outSuffix;
      if (implib == false) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"PREFIX","");
        __s._M_p = cmTarget::GetProperty(this->Target,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SUFFIX","");
        local_108 = cmTarget::GetProperty(this->Target,&local_a0);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"IMPORT_PREFIX","");
        __s._M_p = cmTarget::GetProperty(this->Target,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"IMPORT_SUFFIX","");
        local_108 = cmTarget::GetProperty(this->Target,&local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (psVar6->_M_string_length == 0) {
        local_60 = (char *)0x0;
      }
      else {
        cmsys::SystemTools::UpperCase(&local_c8,psVar6);
        std::__cxx11::string::append((char *)&local_c8);
        pcVar7 = cmTarget::GetProperty(this->Target,&local_c8);
        if (((pcVar7 == (char *)0x0) || (bVar13 = IsAppBundleOnApple(this), bVar13)) ||
           (bVar13 = IsFrameworkOnApple(this), bVar13)) {
          pcVar7 = (char *)0x0;
        }
        local_60 = pcVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar7 = cmTarget::GetPrefixVariableInternal(this->Target,implib);
      local_a4 = (uint)implib;
      local_f8 = cmTarget::GetSuffixVariableInternal(this->Target,implib);
      pLVar8 = GetLinkClosure(this,local_100);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar4 = (pLVar8->LinkerLanguage)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar4,pcVar4 + (pLVar8->LinkerLanguage)._M_string_length);
      if (local_c8._M_string_length != 0) {
        if ((local_108 == (char *)0x0) && (local_f8 != (char *)0x0)) {
          if (*local_f8 == '\0') {
            local_108 = (char *)0x0;
          }
          else {
            local_e8[0] = local_d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"_","");
            pcVar5 = local_f8;
            strlen(local_f8);
            plVar9 = (long *)std::__cxx11::string::replace
                                       ((ulong)local_e8,0,(char *)0x0,(ulong)pcVar5);
            psVar11 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128.field_2._8_8_ = plVar9[3];
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_128._M_string_length = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_128,(ulong)local_c8._M_dataplus._M_p);
            puVar12 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_148.field_2._M_allocated_capacity = *puVar12;
              local_148.field_2._8_8_ = plVar9[3];
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *puVar12;
              local_148._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_148._M_string_length = plVar9[1];
            *plVar9 = (long)puVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_e8[0] != local_d8) {
              operator_delete(local_e8[0],local_d8[0] + 1);
            }
            local_108 = cmMakefile::GetDefinition(this->Makefile,&local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__s._M_p ==
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) && (pcVar7 != (char *)0x0)) {
          if (*pcVar7 == '\0') {
            __s._M_p = (pointer)0x0;
          }
          else {
            local_e8[0] = local_d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"_","");
            strlen(pcVar7);
            plVar9 = (long *)std::__cxx11::string::replace
                                       ((ulong)local_e8,0,(char *)0x0,(ulong)pcVar7);
            psVar11 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128.field_2._8_8_ = plVar9[3];
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_128._M_string_length = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_128,(ulong)local_c8._M_dataplus._M_p);
            puVar12 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_148.field_2._M_allocated_capacity = *puVar12;
              local_148.field_2._8_8_ = plVar9[3];
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *puVar12;
              local_148._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_148._M_string_length = plVar9[1];
            *plVar9 = (long)puVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_e8[0] != local_d8) {
              operator_delete(local_e8[0],local_d8[0] + 1);
            }
            __s._M_p = cmMakefile::GetDefinition(this->Makefile,&local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      if ((pcVar7 != (char *)0x0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__s._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        pcVar3 = this->Makefile;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        sVar10 = strlen(pcVar7);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,pcVar7,pcVar7 + sVar10)
        ;
        __s._M_p = cmMakefile::GetSafeDefinition(pcVar3,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar7 = local_f8;
      if ((local_f8 != (char *)0x0) && (local_108 == (char *)0x0)) {
        pcVar3 = this->Makefile;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        sVar10 = strlen(local_f8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,pcVar7,pcVar7 + sVar10)
        ;
        local_108 = cmMakefile::GetSafeDefinition(pcVar3,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity =
           local_148.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar13 = IsFrameworkOnApple(this);
      if (bVar13) {
        GetOutputName(&local_128,this,local_100,false);
        std::__cxx11::string::operator=((string *)&local_148,(string *)&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_148);
        local_108 = (char *)0x0;
        __s._M_p = local_148._M_dataplus._M_p;
      }
      bVar13 = IsCFBundleOnApple(this);
      if (bVar13) {
        GetCFBundleDirectory(&local_128,this,local_100,false);
        std::__cxx11::string::operator=((string *)&local_148,(string *)&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_148);
        local_108 = (char *)0x0;
        __s._M_p = local_148._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__s._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        __s._M_p = "";
      }
      pcVar7 = (char *)outPrefix->_M_string_length;
      strlen(__s._M_p);
      std::__cxx11::string::_M_replace((ulong)outPrefix,0,pcVar7,(ulong)__s._M_p);
      GetOutputName(&local_128,this,local_100,SUB41(local_a4,0));
      std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_128._M_dataplus._M_p);
      paVar1 = &local_128.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)local_f0);
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"SOVERSION","");
      pcVar7 = cmTarget::GetProperty(this->Target,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (pcVar7 != (char *)0x0) {
        if (implib == false && this->Target->TargetTypeValue == SHARED_LIBRARY) {
          pcVar3 = this->Makefile;
          local_128._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION","");
          bVar13 = cmMakefile::IsOn(pcVar3,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar13 = false;
        }
        if (bVar13 != false) {
          std::__cxx11::string::append((char *)local_f0);
          std::__cxx11::string::append((char *)local_f0);
        }
      }
      psVar6 = local_58;
      pcVar7 = "";
      if (local_108 != (char *)0x0) {
        pcVar7 = local_108;
      }
      pcVar5 = (char *)local_58->_M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)psVar6,0,pcVar5,(ulong)pcVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    return;
  }
  std::__cxx11::string::_M_replace((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x512e03);
  std::__cxx11::string::_M_assign((string *)outBase);
  std::__cxx11::string::_M_replace((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x512e03);
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(const std::string& config,
                                            bool implib,
                                            std::string& outPrefix,
                                            std::string& outBase,
                                            std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if(this->GetType() != cmState::STATIC_LIBRARY &&
     this->GetType() != cmState::SHARED_LIBRARY &&
     this->GetType() != cmState::MODULE_LIBRARY &&
     this->GetType() != cmState::EXECUTABLE)
    {
    outPrefix = "";
    outBase = this->GetName();
    outSuffix = "";
    return;
    }

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if(implib &&
     !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"))
    {
    outPrefix = "";
    outBase = "";
    outSuffix = "";
    return;
    }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if(this->GetType() != cmState::SHARED_LIBRARY &&
     this->GetType() != cmState::MODULE_LIBRARY &&
     this->GetType() != cmState::EXECUTABLE)
    {
    implib = false;
    }

  // Compute the full name for main target types.
  const char* targetPrefix = (implib
                              ? this->GetProperty("IMPORT_PREFIX")
                              : this->GetProperty("PREFIX"));
  const char* targetSuffix = (implib
                              ? this->GetProperty("IMPORT_SUFFIX")
                              : this->GetProperty("SUFFIX"));
  const char* configPostfix = 0;
  if(!config.empty())
    {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if(configPostfix &&
       (this->IsAppBundleOnApple() || this->IsFrameworkOnApple()))
      {
      configPostfix = 0;
      }
    }
  const char* prefixVar = this->Target->GetPrefixVariableInternal(implib);
  const char* suffixVar = this->Target->GetSuffixVariableInternal(implib);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if(!ll.empty())
    {
    if(!targetSuffix && suffixVar && *suffixVar)
      {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
      }
    if(!targetPrefix && prefixVar && *prefixVar)
      {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
      }
    }

  // if there is no prefix on the target use the cmake definition
  if(!targetPrefix && prefixVar)
    {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar);
    }
  // if there is no suffix on the target use the cmake definition
  if(!targetSuffix && suffixVar)
    {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar);
    }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if(this->IsFrameworkOnApple())
    {
    fw_prefix = this->GetOutputName(config, false);
    fw_prefix += ".framework/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  if(this->IsCFBundleOnApple())
    {
    fw_prefix = this->GetCFBundleDirectory(config, false);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = 0;
    }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix?targetPrefix:"";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, implib);

  // Append the per-configuration postfix.
  outBase += configPostfix?configPostfix:"";

  // Name shared libraries with their version number on some platforms.
  if(const char* soversion = this->GetProperty("SOVERSION"))
    {
    if(this->GetType() == cmState::SHARED_LIBRARY && !implib &&
       this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION"))
      {
      outBase += "-";
      outBase += soversion;
      }
    }

  // Append the suffix.
  outSuffix = targetSuffix?targetSuffix:"";
}